

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_fork_test.cpp
# Opt level: O1

int post_callback_test(metacall_pid pid,void *ctx)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MetaCall post fork callback test ",0x21);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,pid);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  post_callback_fired = 1;
  return 0;
}

Assistant:

int post_callback_test(metacall_pid pid, void *ctx)
{
	(void)ctx;

	std::cout << "MetaCall post fork callback test " << (int)pid << std::endl;

	post_callback_fired = 1;

	return 0;
}